

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

Slice * __thiscall Imf_3_4::SampleCountChannel::slice(SampleCountChannel *this)

{
  ImageLevel *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ImageChannel *in_RSI;
  Slice *in_RDI;
  
  pIVar1 = in_RSI[1]._level;
  iVar2 = ImageChannel::pixelsPerRow(in_RSI);
  iVar3 = ImageChannel::xSampling(in_RSI);
  iVar4 = ImageChannel::ySampling(in_RSI);
  Imf_3_4::Slice::Slice(in_RDI,UINT,(char *)pIVar1,4,(long)iVar2 << 2,iVar3,iVar4,0.0,false,false);
  return in_RDI;
}

Assistant:

Slice
SampleCountChannel::slice () const
{
    return Slice (
        UINT,                                    // type
        (char*) _base,                           // base
        sizeof (unsigned int),                   // xStride
        pixelsPerRow () * sizeof (unsigned int), // yStride
        xSampling (),
        ySampling ());
}